

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O2

shared_ptr<SchemeVector> __thiscall
SchemeVector::from_list(SchemeVector *this,shared_ptr<SchemePair> *list)

{
  element_type *peVar1;
  size_type sVar2;
  eval_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<SchemeVector> sVar3;
  initializer_list<const_SchemePair_*> __l;
  allocator_type local_72;
  less<const_SchemePair_*> local_71;
  __shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2> local_70;
  set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
  visited;
  
  std::make_shared<SchemeVector>();
  local_70._M_ptr = (list->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  __l._M_len = 1;
  __l._M_array = &local_70._M_ptr;
  std::set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>::
  set(&visited,__l,&local_71,&local_72);
  do {
    peVar1 = (list->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      this_00 = (eval_error *)__cxa_allocate_exception(0x10);
      eval_error::runtime_error(this_00,"Vector initialization failed: not a list");
LAB_00121afa:
      __cxa_throw(this_00,&eval_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (peVar1 == (element_type *)
                  scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
      std::
      _Rb_tree<const_SchemePair_*,_const_SchemePair_*,_std::_Identity<const_SchemePair_*>,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
      ::~_Rb_tree(&visited._M_t);
      sVar3.super___shared_ptr<SchemeVector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      sVar3.super___shared_ptr<SchemeVector,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
      return (shared_ptr<SchemeVector>)
             sVar3.super___shared_ptr<SchemeVector,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::vector<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::
    push_back((vector<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
               *)((this->super_SchemeObject)._vptr_SchemeObject + 1),&peVar1->car);
    std::dynamic_pointer_cast<SchemePair,SchemeObject>((shared_ptr<SchemeObject> *)&local_70);
    std::__shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&list->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>,&local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    local_70._M_ptr = (list->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    sVar2 = std::
            set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
            ::count(&visited,&local_70._M_ptr);
    if (sVar2 != 0) {
      this_00 = (eval_error *)__cxa_allocate_exception(0x10);
      eval_error::runtime_error(this_00,"Vector initialization failed: not a list");
      goto LAB_00121afa;
    }
    local_70._M_ptr = (list->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::
    _Rb_tree<SchemePair_const*,SchemePair_const*,std::_Identity<SchemePair_const*>,std::less<SchemePair_const*>,std::allocator<SchemePair_const*>>
    ::_M_insert_unique<SchemePair_const*>
              ((_Rb_tree<SchemePair_const*,SchemePair_const*,std::_Identity<SchemePair_const*>,std::less<SchemePair_const*>,std::allocator<SchemePair_const*>>
                *)&visited,&local_70._M_ptr);
  } while( true );
}

Assistant:

std::shared_ptr<SchemeVector> SchemeVector::from_list(std::shared_ptr<SchemePair> list)
{
    auto v = std::make_shared<SchemeVector>();
    std::set<const SchemePair *> visited{list.get()};
    while(list && list != scheme_nil)
    {
        v->vec.push_back(list->car);
        list = std::dynamic_pointer_cast<SchemePair>(list->cdr);
        if(visited.count(list.get()))
            throw eval_error("Vector initialization failed: not a list");
        visited.insert(list.get());
    }
    if(!list)
        throw eval_error("Vector initialization failed: not a list");
    return v;
}